

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type-printing.h
# Opt level: O0

void __thiscall
wasm::
TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
::assertValidUsage(TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
                   *this)

{
  TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
  *this_local;
  
  return;
}

Assistant:

constexpr void assertValidUsage() {
#if !defined(__GNUC__) || __GNUC__ >= 14
    // Check that the subclass provides `getNames` with the correct type.
    using Self = TypeNameGeneratorBase<Subclass>;
    static_assert(
      static_cast<TypeNames (Self::*)(HeapType)>(&Self::getNames) !=
        static_cast<TypeNames (Self::*)(HeapType)>(&Subclass::getNames),
      "Derived class must implement getNames");
#endif
  }